

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O2

int shiftcnt(uint32_t x)

{
  uint uVar1;
  
  uVar1 = 0;
  if (x != 0) {
    for (; (uVar1 < 0x20 && ((x & 1) == 0)); x = x >> 1) {
      uVar1 = uVar1 + 1;
    }
  }
  return uVar1;
}

Assistant:

int shiftcnt(uint32_t x)
/* returns number of 0-bits before the first 1-bit - something like */
/* an integer-log2() function - returns 0 on x=0 */
{
  int i;

  if (x == 0)
    return 0;
  for (i=0; i<32; i++) {
    if (x & 1)
      break;
    x >>= 1;
  }
  return i;
}